

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

CNode * __thiscall
ConnmanTestMsg::ConnectNodePublic
          (ConnmanTestMsg *this,PeerManager *peerman,char *pszDest,ConnectionType conn_type)

{
  long lVar1;
  long in_RSI;
  long in_FS_OFFSET;
  CNode *node;
  undefined1 in_stack_0000021f;
  ConnectionType in_stack_00000220;
  undefined1 in_stack_00000227;
  CAddress *in_stack_00000228;
  CConnman *in_stack_00000230;
  char *in_stack_00000410;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  CNode *in_stack_ffffffffffffff60;
  CAddress *in_stack_ffffffffffffff78;
  CNode *in_stack_ffffffffffffff88;
  undefined8 local_48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CAddress::CAddress(in_stack_ffffffffffffff78);
  local_48 = ::CConnman::ConnectNode
                       (in_stack_00000230,in_stack_00000228,in_stack_00000410,
                        (bool)in_stack_00000227,in_stack_00000220,(bool)in_stack_0000021f);
  CAddress::~CAddress((CAddress *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  if (local_48 == (CNode *)0x0) {
    local_48 = (CNode *)0x0;
  }
  else {
    CNode::SetCommonVersion(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    (*(code *)**(undefined8 **)(in_RSI + 8))(in_RSI + 8,local_48,9);
    std::atomic<bool>::operator=
              ((atomic<bool> *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),false);
    AddTestNode((ConnmanTestMsg *)local_48,in_stack_ffffffffffffff88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_48;
  }
  __stack_chk_fail();
}

Assistant:

CNode* ConnmanTestMsg::ConnectNodePublic(PeerManager& peerman, const char* pszDest, ConnectionType conn_type)
{
    CNode* node = ConnectNode(CAddress{}, pszDest, /*fCountFailure=*/false, conn_type, /*use_v2transport=*/true);
    if (!node) return nullptr;
    node->SetCommonVersion(PROTOCOL_VERSION);
    peerman.InitializeNode(*node, ServiceFlags(NODE_NETWORK | NODE_WITNESS));
    node->fSuccessfullyConnected = true;
    AddTestNode(*node);
    return node;
}